

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  wchar_t wVar1;
  char *__s;
  int *piVar2;
  size_t local_98;
  size_t sStack_78;
  int r;
  size_t size;
  char *encoded_name;
  char *url_encoded_name;
  char *encoded_value;
  void *value;
  char *name;
  undefined1 auStack_40 [4];
  int i;
  archive_string s;
  archive_entry *entry_local;
  pax *pax_local;
  archive_write *a_local;
  
  s.buffer_length = (size_t)entry;
  name._4_4_ = archive_entry_xattr_reset(entry);
  do {
    if (name._4_4_ == L'\0') {
      return 0;
    }
    encoded_name = (char *)0x0;
    size = 0;
    name._4_4_ = name._4_4_ + L'\xffffffff';
    archive_entry_xattr_next
              ((archive_entry *)s.buffer_length,(char **)&value,&encoded_value,
               &stack0xffffffffffffff88);
    __s = url_encode((char *)value);
    encoded_name = __s;
    if (__s != (char *)0x0) {
      if (__s == (char *)0x0) {
        local_98 = 0;
      }
      else {
        local_98 = strlen(__s);
      }
      wVar1 = archive_strncpy_l(&pax->l_url_encoded_name,__s,local_98,pax->sconv_utf8);
      free(encoded_name);
      if (wVar1 == L'\0') {
        size = (size_t)(pax->l_url_encoded_name).s;
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 0xc) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
          return -0x1e;
        }
      }
    }
    url_encoded_name = base64_encode(encoded_value,sStack_78);
    if ((size != 0) && (url_encoded_name != (char *)0x0)) {
      _auStack_40 = (char *)0x0;
      s.length = 0;
      s.s = (char *)0x0;
      archive_strncat((archive_string *)auStack_40,"LIBARCHIVE.xattr.",0x11);
      archive_strcat((archive_string *)auStack_40,(void *)size);
      add_pax_attr(&pax->pax_header,_auStack_40,url_encoded_name);
      archive_string_free((archive_string *)auStack_40);
    }
    free(url_encoded_name);
  } while( true );
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	struct archive_string s;
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *encoded_value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		encoded_value = base64_encode((const char *)value, size);

		if (encoded_name != NULL && encoded_value != NULL) {
			archive_string_init(&s);
			archive_strcpy(&s, "LIBARCHIVE.xattr.");
			archive_strcat(&s, encoded_name);
			add_pax_attr(&(pax->pax_header), s.s, encoded_value);
			archive_string_free(&s);
		}
		free(encoded_value);
	}
	return (ARCHIVE_OK);
}